

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O1

int __thiscall CGL::SceneObjects::EnvironmentLight::init(EnvironmentLight *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pVVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  int iVar9;
  double *pdVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  uVar3 = this->envMap->w;
  uVar4 = this->envMap->h;
  iVar9 = (int)uVar3;
  iVar18 = (int)uVar4;
  uVar17 = (ulong)(uint)(iVar9 * iVar18) << 3;
  pdVar10 = (double *)operator_new__(uVar17);
  this->pdf_envmap = pdVar10;
  pdVar10 = (double *)operator_new__(uVar17);
  this->conds_y = pdVar10;
  pdVar10 = (double *)operator_new__((uVar4 & 0xffffffff) * 8);
  this->marginal_y = pdVar10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[PathTracer] Initializing environment light...",0x2e);
  if (iVar18 == 0) {
    dVar21 = 0.0;
  }
  else {
    dVar21 = 0.0;
    uVar15 = 0;
    dVar19 = 0.0;
    iVar16 = 0;
    do {
      if (iVar9 != 0) {
        uVar17 = uVar3 & 0xffffffff;
        uVar11 = uVar15;
        do {
          pVVar5 = (this->envMap->data).
                   super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar22 = pVVar5[uVar11].field_0.field_0.y;
          dVar1 = pVVar5[uVar11].field_0.field_0.x;
          dVar2 = pVVar5[uVar11].field_0.field_0.z;
          dVar20 = sin(((dVar19 + 0.5) * 3.141592653589793) / (double)(uVar4 & 0xffffffff));
          dVar20 = dVar20 * (double)(float)(dVar2 * 0.0722000002861023 +
                                           dVar1 * 0.2125999927520752 + dVar22 * 0.7152000069618225)
          ;
          this->pdf_envmap[uVar11] = dVar20;
          dVar21 = dVar21 + dVar20;
          uVar11 = uVar11 + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      dVar19 = dVar19 + 1.0;
      iVar16 = iVar16 + 1;
      uVar15 = uVar15 + iVar9;
    } while (iVar16 != iVar18);
  }
  if (iVar18 != 0) {
    pdVar10 = this->pdf_envmap;
    uVar15 = 0;
    iVar16 = 0;
    do {
      uVar17 = uVar3 & 0xffffffff;
      uVar11 = uVar15;
      if (iVar9 != 0) {
        do {
          pdVar10[uVar11] = pdVar10[uVar11] / dVar21;
          uVar11 = uVar11 + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      iVar16 = iVar16 + 1;
      uVar15 = uVar15 + iVar9;
    } while (iVar16 != iVar18);
    pdVar10 = this->pdf_envmap;
    pdVar6 = this->marginal_y;
    uVar17 = 0;
    uVar12 = 0;
    do {
      if (uVar12 == 0) {
        dVar21 = 0.0;
      }
      else {
        dVar21 = pdVar6[uVar12 - 1];
      }
      pdVar6[uVar12] = dVar21;
      if (iVar9 != 0) {
        dVar21 = pdVar6[uVar12];
        uVar13 = uVar3 & 0xffffffff;
        uVar14 = uVar17;
        do {
          dVar21 = dVar21 + pdVar10[uVar14 & 0xffffffff];
          pdVar6[uVar12] = dVar21;
          uVar14 = uVar14 + 1;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      uVar12 = uVar12 + 1;
      uVar17 = uVar17 + uVar3;
    } while (uVar12 != (uVar4 & 0xffffffff));
    pdVar10 = this->pdf_envmap;
    pdVar6 = this->marginal_y;
    pdVar7 = this->conds_y;
    uVar17 = 0;
    uVar12 = 0;
    do {
      if (uVar12 == 0) {
        dVar21 = 0.0;
      }
      else {
        dVar21 = pdVar6[uVar12 - 1];
      }
      if (iVar9 != 0) {
        dVar19 = pdVar6[uVar12];
        pdVar8 = this->conds_y;
        uVar14 = 0;
        uVar13 = uVar17;
        do {
          if (uVar14 == 0) {
            dVar22 = 0.0;
          }
          else {
            dVar22 = pdVar8[(int)uVar13 - 1];
          }
          pdVar7[uVar13 & 0xffffffff] = dVar22 + pdVar10[uVar13 & 0xffffffff] / (dVar19 - dVar21);
          uVar14 = uVar14 + 1;
          uVar13 = uVar13 + 1;
        } while ((uVar3 & 0xffffffff) != uVar14);
      }
      uVar12 = uVar12 + 1;
      uVar17 = uVar17 + uVar3;
    } while (uVar12 != (uVar4 & 0xffffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Saving out probability_debug image for debug.",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  save_probability_debug(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  iVar9 = std::ostream::flush();
  return iVar9;
}

Assistant:

void EnvironmentLight::init() {
    uint32_t w = envMap->w, h = envMap->h;
    pdf_envmap = new double[w * h];
    conds_y = new double[w * h];
    marginal_y = new double[h];

    std::cout << "[PathTracer] Initializing environment light...";

    // 3-2 Part 3 Task 3 Steps 1,2,3
    // Store the environment map pdf to pdf_envmap
    // Store the marginal distribution for y to marginal_y
    // Store the conditional distribution for x given y to conds_y

    double sum = 0;
    for (int j = 0; j < h; ++j) {
      for (int i = 0; i < w; ++i) {
        pdf_envmap[w * j + i] = envMap->data[w * j + i].illum() * sin(PI * (j + .5) / h);
        sum += pdf_envmap[w * j + i];
      }
    }

    // normalize so pdf_envmap sums to 1
    for (int j = 0; j < h; ++j) {
      for (int i = 0; i < w; ++i) {
        pdf_envmap[w * j + i] /= sum;
      }
    }

    // compute marginal distribution
    for (int j = 0; j < h; ++j) {
      marginal_y[j] = (j == 0 ? 0 : marginal_y[j-1]);
      for (int i = 0; i < w; ++i) {
        marginal_y[j] += pdf_envmap[w * j + i];
      }
    }

    // compute conditional distributions
    for (int j = 0; j < h; ++j) {
      double marginal_density = marginal_y[j] - (j == 0 ? 0 : marginal_y[j-1]);
      for (int i = 0; i < w; ++i) {
        conds_y[w * j + i] = (i == 0 ? 0 : conds_y[w * j + i - 1]) + pdf_envmap[w * j + i] / marginal_density;
      }
    }

    if (true)
      std::cout << "Saving out probability_debug image for debug." << std::endl;
    save_probability_debug();

    std::cout << "done." << std::endl;
  }